

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O3

Future<std::error_code> * __thiscall
cinatra::coro_http_server::async_start
          (Future<std::error_code> *__return_storage_ptr__,coro_http_server *this)

{
  int iVar1;
  socklen_t *__addr_len;
  int in_EDX;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 uVar3;
  Promise<std::error_code> promise;
  undefined1 local_40 [16];
  undefined1 local_30;
  _Variadic_union<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr> local_28;
  coro_http_server *local_18;
  
  iVar1 = listen(this,(int)this,in_EDX);
  (this->errc_)._M_value = iVar1;
  (this->errc_)._M_cat = (error_category *)CONCAT44(extraout_var,extraout_EDX);
  local_40._8_8_ = operator_new(0x60);
  *(undefined2 *)local_40._8_8_ = 0;
  __addr_len = (socklen_t *)0x0;
  *(undefined1 *)(local_40._8_8_ + 2) = 0;
  *(undefined1 *)(local_40._8_8_ + 0x18) = 0;
  *(undefined8 *)(local_40._8_8_ + 0x40) = 0;
  *(undefined8 *)(local_40._8_8_ + 0x48) = 0;
  *(undefined8 *)(local_40._8_8_ + 0x49) = 0;
  *(undefined8 *)(local_40._8_8_ + 0x51) = 0;
  local_30 = 0;
  LOCK();
  *(long *)(local_40._8_8_ + 0x50) = *(long *)(local_40._8_8_ + 0x50) + 1;
  UNLOCK();
  LOCK();
  *(char *)(local_40._8_8_ + 1) = *(char *)(local_40._8_8_ + 1) + '\x01';
  UNLOCK();
  async_simple::Promise<std::error_code>::getFuture
            (__return_storage_ptr__,(Promise<std::error_code> *)(local_40 + 8));
  if ((this->errc_)._M_value == 0) {
    uVar2 = extraout_EDX_00;
    uVar3 = extraout_var_00;
    if (this->out_ctx_ == (io_context *)0x0) {
      local_40._0_8_ = this;
      std::thread::thread<cinatra::coro_http_server::async_start()::_lambda()_1_,,void>
                ((thread *)&local_28,(anon_class_8_1_8991fb9c_for__M_head_impl *)local_40);
      if ((this->thd_)._M_id._M_thread != 0) {
        std::terminate();
      }
      (this->thd_)._M_id._M_thread = (native_handle_type)local_28._M_rest._0_8_;
      uVar2 = extraout_EDX_01;
      uVar3 = extraout_var_01;
    }
    accept((coro_http_server *)local_40,(int)this,(sockaddr *)CONCAT44(uVar3,uVar2),__addr_len);
    local_28._M_rest._M_rest = (_Variadic_union<std::__exception_ptr::exception_ptr>)local_40._8_8_;
    local_28._8_1_ = local_30;
    local_40._8_8_ = (_Variadic_union<std::__exception_ptr::exception_ptr>)0x0;
    local_30 = 0;
    local_18 = this;
    async_simple::coro::detail::LazyBase<std::error_code,_false>::
    start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_coro_http_server_hpp:96:22)>
              ((LazyBase<std::error_code,_false> *)local_40,(type *)&local_28);
    async_simple::Promise<std::error_code>::~Promise((Promise<std::error_code> *)&local_28);
    if ((coro_http_server *)local_40._0_8_ != (coro_http_server *)0x0) {
      (*(code *)(((vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                   *)local_40._0_8_)->
                super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                )._M_impl.super__Vector_impl_data._M_finish)();
    }
  }
  else {
    local_28._M_rest._0_8_ = (undefined8)*(undefined8 *)&this->errc_;
    local_28._8_8_ = (this->errc_)._M_cat;
    local_18 = (coro_http_server *)CONCAT71(local_18._1_7_,1);
    async_simple::Promise<std::error_code>::setValue
              ((Promise<std::error_code> *)(local_40 + 8),(Try<std::error_code> *)&local_28);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>::
    ~_Variant_storage((_Variant_storage<false,_std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
                       *)&local_28);
  }
  async_simple::Promise<std::error_code>::~Promise((Promise<std::error_code> *)(local_40 + 8));
  return __return_storage_ptr__;
}

Assistant:

async_simple::Future<std::error_code> async_start() {
    errc_ = listen();

    async_simple::Promise<std::error_code> promise;
    auto future = promise.getFuture();

    if (!errc_) {
      if (out_ctx_ == nullptr) {
        thd_ = std::thread([this] {
          pool_->run();
        });
      }

      accept().start([p = std::move(promise), this](auto &&res) mutable {
        if (res.hasError()) {
          errc_ = std::make_error_code(std::errc::io_error);
          p.setValue(errc_);
        }
        else {
          p.setValue(res.value());
        }
      });
    }
    else {
      promise.setValue(errc_);
    }

    return future;
  }